

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O3

bool __thiscall OpenGliderConnection::ProcessFetchedData(OpenGliderConnection *this)

{
  int iVar1;
  double dVar2;
  _Alloc_hider _Var3;
  long *plVar4;
  bool bVar5;
  int iVar6;
  FlarmAircraftTy FVar7;
  time_t tVar8;
  char *pcVar9;
  char *pcVar10;
  int *piVar11;
  long lVar12;
  mapped_type *this_00;
  char *pcVar13;
  undefined8 uVar14;
  long lVar15;
  FlarmAircraftTy _acTy;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tok;
  unique_lock<std::mutex> mapFdLock;
  FDKeyTy fdKey;
  string sMarker;
  string acFilter;
  FDStaticData stat;
  FDDynamicData dyn;
  positionTy viewPos;
  char buf [100];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  OpenGliderConnection *local_3e8;
  string local_3e0;
  unique_lock<std::mutex> local_3c0;
  pthread_mutex_t *local_3b0;
  long local_3a8;
  FDKeyTy local_3a0;
  string local_370;
  long *local_350;
  size_t local_348;
  long local_340 [2];
  positionTy local_330;
  double local_2e8;
  string local_2e0;
  undefined1 local_2c0 [64];
  _Alloc_hider local_280;
  char *local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Alloc_hider local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  _Alloc_hider local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Alloc_hider local_220;
  char *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined8 local_200;
  int local_1f8;
  bool local_1f4;
  Doc8643 *local_1f0;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  pointer local_1c8;
  pointer pbStack_1c0;
  pointer local_1b8;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  char *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined2 local_130;
  FDDynamicData local_128;
  positionTy local_e0;
  char local_98 [104];
  
  DataRefs::GetDebugAcFilter_abi_cxx11_(&local_2e0,&dataRefs);
  local_3e8 = this;
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos != 0) {
    tVar8 = time((time_t *)0x0);
    local_3a8 = lround(dataRefs.chTsOffset);
    DataRefs::GetViewPos();
    pcVar9 = strstr((local_3e8->super_LTFlightDataChannel).super_LTOnlineChannel.netData,"<m a=\"");
    if (pcVar9 != (char *)0x0) {
      local_3a8 = local_3a8 + tVar8;
      while( true ) {
        pcVar9 = pcVar9 + 6;
        pcVar10 = strstr(pcVar9,"\"/>");
        if (pcVar10 == (char *)0x0) break;
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,pcVar9,pcVar10);
        local_2c0._0_8_ = local_2c0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,",","");
        str_tokenize(&local_400,&local_370,(string *)local_2c0,false);
        if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
          operator_delete((void *)local_2c0._0_8_,CONCAT71(local_2c0._17_7_,local_2c0[0x10]) + 1);
        }
        if ((long)local_400.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_400.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x1c0) {
          pcVar10 = local_400.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
          piVar11 = __errno_location();
          iVar6 = *piVar11;
          *piVar11 = 0;
          lVar12 = strtol(pcVar10,(char **)local_2c0,10);
          if ((char *)local_2c0._0_8_ == pcVar10) {
            std::__throw_invalid_argument("stol");
LAB_0018a80e:
            uVar14 = std::__throw_out_of_range("stol");
            goto LAB_0018a81a;
          }
          if (*piVar11 == 0) {
            *piVar11 = iVar6;
          }
          else if (*piVar11 == 0x22) goto LAB_0018a80e;
          lVar15 = -lVar12;
          if (0 < lVar12) {
            lVar15 = lVar12;
          }
          bVar5 = false;
          if (lVar15 < dataRefs.fdBufPeriod) {
            local_3a0.eKeyType = KEY_UNKNOWN;
            local_3a0.key._M_dataplus._M_p = (pointer)&local_3a0.key.field_2;
            local_3a0.key._M_string_length = 0;
            local_3a0.key.field_2._M_local_buf[0] = '\0';
            local_3a0.num = 0;
            local_2c0._0_8_ = local_2c0 + 0x10;
            local_2c0._8_8_ = 0;
            local_2c0[0x10] = '\0';
            local_2c0._32_8_ = local_2c0 + 0x30;
            local_2c0._40_8_ = 0;
            local_2c0[0x30] = '\0';
            local_280._M_p = (pointer)&local_270;
            local_278 = (char *)0x0;
            local_270._M_local_buf[0] = '\0';
            local_260._M_p = (pointer)&local_250;
            local_258 = 0;
            local_250._M_local_buf[0] = '\0';
            local_240._M_p = (pointer)&local_230;
            local_238 = 0;
            local_230._M_local_buf[0] = '\0';
            local_220._M_p = (pointer)&local_210;
            local_218 = (char *)0x0;
            local_210._M_local_buf[0] = '\0';
            local_200._0_4_ = -1;
            local_200._4_4_ = -1;
            local_1f8 = 0;
            local_1f4 = false;
            local_1f0 = (Doc8643 *)0x0;
            local_1e8._M_p = (pointer)&local_1d8;
            local_1e0 = 0;
            local_1d8._M_local_buf[0] = '\0';
            local_1b8 = (pointer)0x0;
            local_1c8 = (pointer)0x0;
            pbStack_1c0 = (pointer)0x0;
            local_1b0._M_p = (pointer)&local_1a0;
            local_1a8 = 0;
            local_1a0._M_local_buf[0] = '\0';
            local_190._M_p = (pointer)&local_180;
            local_188 = (char *)0x0;
            local_180._M_local_buf[0] = '\0';
            local_170._M_p = (pointer)&local_160;
            local_168 = 0;
            local_160._M_local_buf[0] = '\0';
            local_150._M_p = (pointer)&local_140;
            local_148 = 0;
            local_140._M_local_buf[0] = '\0';
            local_130._0_1_ = false;
            local_130._1_1_ = false;
            bVar5 = AcListLookup(local_3e8,
                                 local_400.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 0xc,&local_3a0,
                                 (FDStaticData *)local_2c0);
            if (bVar5) {
              if (local_2e0._M_string_length != 0) {
                local_350 = local_340;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_350,local_2e0._M_dataplus._M_p,
                           local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
                plVar4 = local_350;
                if (local_3a0.key._M_string_length == local_348) {
                  if (local_3a0.key._M_string_length == 0) {
                    if (local_350 != local_340) {
                      operator_delete(local_350,local_340[0] + 1);
                    }
                    goto LAB_00189fa7;
                  }
                  iVar6 = bcmp(local_3a0.key._M_dataplus._M_p,local_350,
                               local_3a0.key._M_string_length);
                  bVar5 = iVar6 != 0;
                }
                else {
                  bVar5 = true;
                }
                if (plVar4 != local_340) {
                  operator_delete(plVar4,local_340[0] + 1);
                }
                if (bVar5) goto LAB_0018a54b;
              }
LAB_00189fa7:
              local_3c0._M_device = &mapFdMutex;
              local_3c0._M_owns = false;
              std::unique_lock<std::mutex>::lock(&local_3c0);
              local_3c0._M_owns = true;
              this_00 = std::
                        map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                        ::operator[](&mapFd,&local_3a0);
              local_3b0 = (pthread_mutex_t *)&this_00->dataAccessMutex;
              iVar6 = pthread_mutex_lock(local_3b0);
              if (iVar6 != 0) {
                std::__throw_system_error(iVar6);
              }
              std::unique_lock<std::mutex>::unlock(&local_3c0);
              if ((this_00->acKey).key._M_string_length == 0) {
                LTFlightData::SetKey(this_00,&local_3a0);
                pcVar10 = local_400.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[10]._M_dataplus._M_p;
                iVar6 = *piVar11;
                *piVar11 = 0;
                lVar12 = strtol(pcVar10,(char **)&local_128,10);
                if ((char *)local_128.radar.size == pcVar10) {
                  uVar14 = std::__throw_invalid_argument("stoi");
                  goto LAB_0018a81a;
                }
                FVar7 = (FlarmAircraftTy)lVar12;
                if (((int)FVar7 != lVar12) || (*piVar11 == 0x22)) {
                  uVar14 = std::__throw_out_of_range("stoi");
                  goto LAB_0018a81a;
                }
                if (*piVar11 == 0) {
                  *piVar11 = iVar6;
                }
                _acTy = FVar7;
                if ((FAT_AIRSHIP|FAT_TOW_PLANE) < FVar7) {
                  _acTy = FAT_STATIC_OBJ;
                }
                if ((int)FVar7 < 0) {
                  _acTy = FAT_UNKNOWN;
                }
                pcVar13 = OGNGetAcTypeName(_acTy);
                pcVar10 = local_218;
                strlen(pcVar13);
                std::__cxx11::string::_M_replace((ulong)&local_220,0,pcVar10,(ulong)pcVar13);
                if (_acTy == FAT_STATIC_OBJ) {
                  std::__cxx11::string::_M_replace((ulong)&local_280,0,local_278,0x24bc73);
                  std::__cxx11::string::_M_assign((string *)local_2c0);
                }
                if (local_278 == (char *)0x0) {
                  OGNGetIcaoAcType_abi_cxx11_(_acTy);
                  std::__cxx11::string::_M_assign((string *)&local_280);
                }
                if (local_238 == 0) {
                  std::__cxx11::string::_M_assign((string *)&local_240);
                }
              }
              LTFlightData::FDDynamicData::FDDynamicData(&local_128);
              local_128.ts = (double)(local_3a8 - lVar15);
              local_128.gnd = false;
              pcVar10 = local_400.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
              iVar6 = *piVar11;
              *piVar11 = 0;
              dVar2 = strtod(pcVar10,(char **)&local_330);
              if ((char *)local_330._lat == pcVar10) {
                uVar14 = std::__throw_invalid_argument("stod");
LAB_0018a81a:
                LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)local_2c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0.key._M_dataplus._M_p != &local_3a0.key.field_2) {
                  operator_delete(local_3a0.key._M_dataplus._M_p,
                                  CONCAT71(local_3a0.key.field_2._M_allocated_capacity._1_7_,
                                           local_3a0.key.field_2._M_local_buf[0]) + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_400);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_370._M_dataplus._M_p != &local_370.field_2) {
                  operator_delete(local_370._M_dataplus._M_p,
                                  local_370.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                  operator_delete(local_2e0._M_dataplus._M_p,
                                  local_2e0.field_2._M_allocated_capacity + 1);
                }
                _Unwind_Resume(uVar14);
              }
              iVar1 = *piVar11;
              if (iVar1 == 0) {
                *piVar11 = iVar6;
              }
              else {
                iVar6 = iVar1;
                if (iVar1 == 0x22) {
                  uVar14 = std::__throw_out_of_range("stod");
                  goto LAB_0018a81a;
                }
              }
              pcVar10 = local_400.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[8]._M_dataplus._M_p;
              *piVar11 = 0;
              local_128.heading = dVar2;
              dVar2 = strtod(pcVar10,(char **)&local_330);
              if ((char *)local_330._lat == pcVar10) {
                uVar14 = std::__throw_invalid_argument("stod");
                goto LAB_0018a81a;
              }
              iVar1 = *piVar11;
              if (iVar1 == 0) {
                *piVar11 = iVar6;
              }
              else {
                iVar6 = iVar1;
                if (iVar1 == 0x22) {
                  uVar14 = std::__throw_out_of_range("stod");
                  goto LAB_0018a81a;
                }
              }
              local_128.spd = dVar2 * 0.5399568034557235;
              pcVar10 = local_400.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[9]._M_dataplus._M_p;
              *piVar11 = 0;
              dVar2 = strtod(pcVar10,(char **)&local_330);
              if ((char *)local_330._lat == pcVar10) {
                uVar14 = std::__throw_invalid_argument("stod");
                goto LAB_0018a81a;
              }
              iVar1 = *piVar11;
              if (iVar1 == 0) {
                *piVar11 = iVar6;
              }
              else {
                iVar6 = iVar1;
                if (iVar1 == 0x22) {
                  uVar14 = std::__throw_out_of_range("stod");
                  goto LAB_0018a81a;
                }
              }
              local_128.pChannel = (LTChannel *)local_3e8;
              pcVar10 = ((local_400.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
              *piVar11 = 0;
              local_128.vsi = dVar2;
              pcVar13 = (char *)strtod(pcVar10,(char **)&local_3e0);
              if (local_3e0._M_dataplus._M_p == pcVar10) {
                uVar14 = std::__throw_invalid_argument("stod");
                goto LAB_0018a81a;
              }
              iVar1 = *piVar11;
              if (iVar1 == 0) {
                *piVar11 = iVar6;
              }
              else {
                iVar6 = iVar1;
                if (iVar1 == 0x22) {
                  uVar14 = std::__throw_out_of_range("stod");
                  goto LAB_0018a81a;
                }
              }
              pcVar10 = local_400.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
              *piVar11 = 0;
              dVar2 = strtod(pcVar10,(char **)&local_3e0);
              if (local_3e0._M_dataplus._M_p == pcVar10) {
                uVar14 = std::__throw_invalid_argument("stod");
                goto LAB_0018a81a;
              }
              iVar1 = *piVar11;
              local_2e8 = dVar2;
              if (iVar1 == 0) {
                *piVar11 = iVar6;
              }
              else {
                iVar6 = iVar1;
                if (iVar1 == 0x22) {
                  uVar14 = std::__throw_out_of_range("stod");
                  goto LAB_0018a81a;
                }
              }
              pcVar10 = local_400.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
              *piVar11 = 0;
              dVar2 = strtod(pcVar10,(char **)&local_3e0);
              if (local_3e0._M_dataplus._M_p == pcVar10) {
                uVar14 = std::__throw_invalid_argument("stod");
                goto LAB_0018a81a;
              }
              if (*piVar11 == 0) {
                *piVar11 = iVar6;
              }
              else if (*piVar11 == 0x22) {
                uVar14 = std::__throw_out_of_range("stod");
                goto LAB_0018a81a;
              }
              local_330._lon = local_2e8;
              local_330._ts = local_128.ts;
              local_330._head = local_128.heading;
              local_330._pitch = NAN;
              local_330._roll = NAN;
              local_330.mergeCount = 1;
              local_330.edgeIdx = 0xffffffffffffffff;
              local_330.f = (posFlagsTy)((ushort)local_330.f & 0x8000);
              local_330._lat = (double)pcVar13;
              local_330._alt = dVar2;
              snprintf(local_98,100,"http://live.glidernet.org/#c=%.5f,%.5f&z=9&s=1",(int)pcVar13);
              pcVar10 = local_188;
              strlen(local_98);
              std::__cxx11::string::_M_replace((ulong)&local_190,0,pcVar10,(ulong)local_98);
              dVar2 = CoordDistance(&local_330,&local_e0);
              LTFlightData::UpdateData(this_00,(FDStaticData *)local_2c0,dVar2,DATREQU_NONE);
              bVar5 = positionTy::isNormal(&local_330,true);
              _Var3._M_p = local_3a0.key._M_dataplus._M_p;
              if (bVar5) {
                LTFlightData::AddDynData(this_00,&local_128,0,0,&local_330);
              }
              else if ((int)dataRefs.iLogLevel < 1) {
                positionTy::dbgTxt_abi_cxx11_(&local_3e0,&local_330);
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
                       ,0x189,"ProcessFetchedData",logDEBUG,"A/c %s reached invalid pos: %s",
                       _Var3._M_p,local_3e0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                  operator_delete(local_3e0._M_dataplus._M_p,
                                  local_3e0.field_2._M_allocated_capacity + 1);
                }
              }
              pthread_mutex_unlock(local_3b0);
              std::unique_lock<std::mutex>::~unique_lock(&local_3c0);
            }
LAB_0018a54b:
            bVar5 = false;
            LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)local_2c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0.key._M_dataplus._M_p != &local_3a0.key.field_2) {
              operator_delete(local_3a0.key._M_dataplus._M_p,
                              CONCAT71(local_3a0.key.field_2._M_allocated_capacity._1_7_,
                                       local_3a0.key.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        else {
          bVar5 = true;
          if ((int)dataRefs.iLogLevel < 4) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
                   ,0x12a,"ProcessFetchedData",logERR,
                   "OGN response contains wrong number of fields: %s",local_370._M_dataplus._M_p);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_400);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        if ((bVar5) || (pcVar9 = strstr(pcVar9,"<m a=\""), pcVar9 == (char *)0x0))
        goto LAB_0018a7cd;
      }
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
               ,0x122,"ProcessFetchedData",logERR,
               "OGN response malformed, end of XML element missing: %s",pcVar9);
      }
    }
  }
LAB_0018a7cd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool OpenGliderConnection::ProcessFetchedData ()
{
    char buf[100];

    // any a/c filter defined for debugging purposes?
    std::string acFilter ( dataRefs.GetDebugAcFilter() );
    
    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) return true;
    
    // We need current Zulu time to interpret the timestamp in the data
    const std::time_t tNow = std::time(nullptr) + std::lround(dataRefs.GetChTsOffset());
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();

    // Search for all markers in the response
    for (const char* sPos = strstr(netData, OGN_MARKER_BEGIN);
         sPos != nullptr;
         sPos = strstr(sPos, OGN_MARKER_BEGIN))
    {
        // increase sPos to actual begining of definition
        sPos += OGN_MARKER_BEGIN_LEN;
        
        // find the end of the marker definition
        const char* sEnd = strstr(sPos, OGN_MARKER_END);
        if (!sEnd) {
            LOG_MSG(logERR, ERR_OGN_XLM_END_MISSING, sPos);
            break;
        }
        
        // then this is the marker definition to work on
        const std::string sMarker (sPos, std::string::size_type(sEnd-sPos));
        std::vector<std::string> tok = str_tokenize(sMarker, ",", false);
        if (tok.size() != GNF_COUNT) {
            LOG_MSG(logERR, ERR_OGN_WRONG_NUM_FIELDS, sMarker.c_str());
            break;
        }
        
        // We skip records, which are outdated by the time they arrive
        const long age_s = std::abs(std::stol(tok[GNF_AGE_S]));
        if (age_s >= dataRefs.GetFdBufPeriod())
            continue;

        // Look up the device in the DDB / Aircraft list.
        // This also checks if the device wants to be tracked and sets the key accordingly
        LTFlightData::FDKeyTy fdKey;
        LTFlightData::FDStaticData stat;
        if (!AcListLookup(tok[GNF_FLARM_DEVICE_ID], fdKey, stat))
            continue;                   // device doesn't want to be tracked -> ignore!
        
        // key not matching a/c filter? -> skip it
        if ((!acFilter.empty() && (fdKey != acFilter)) )
            continue;
        
        try {
            // from here on access to fdMap guarded by a mutex
            // until FD object is inserted and updated
            std::unique_lock<std::mutex> mapFdLock (mapFdMutex);
            
            // get the fd object from the map
            // this fetches an existing or, if not existing, creates a new one
            LTFlightData& fd = mapFd[fdKey];
            
            // also get the data access lock once and for all
            // so following fetch/update calls only make quick recursive calls
            std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
            // now that we have the detail lock we can release the global one
            mapFdLock.unlock();

            // completely new? fill key fields and define static data
            // (for OGN some data we only define initially,
            //  ICAO a/c type derivation has a random element
            //  (if more than one ICAO type is defined))
            if ( fd.empty() ) {
                fd.SetKey(fdKey);
            
                // Aircraft type converted from Flarm AcftType
                const FlarmAircraftTy acTy = (FlarmAircraftTy)std::clamp<int>(std::stoi(tok[GNF_FLARM_ACFT_TYPE]),
                                                                              FAT_UNKNOWN, FAT_STATIC_OBJ);
                stat.catDescr   = OGNGetAcTypeName(acTy);

                // Static objects are always mapped to TWR, all others can be configured by the user
                if (acTy == FAT_STATIC_OBJ) {
                    stat.reg = stat.acTypeIcao = STATIC_OBJECT_TYPE;
                }
                
                // If we still have no accurate ICAO type then we need to fall back to some configured defaults
                if (stat.acTypeIcao.empty())
                    stat.acTypeIcao = OGNGetIcaoAcType(acTy);
                if (stat.mdl.empty())
                    stat.mdl        = stat.catDescr;
            }
                        
            // dynamic data
            {   // unconditional...block is only for limiting local variables
                LTFlightData::FDDynamicData dyn;
                
                // position time: zulu time is given in the data, but it is even easier
                //                when using the age, which is always given relative to the query time
                dyn.ts = double(tNow - age_s);
                
                // non-positional dynamic data
                dyn.gnd =               false;      // there is no GND indicator in OGN data
                dyn.heading =           std::stod(tok[GNF_TRK]);
                dyn.spd =               std::stod(tok[GNF_SPEED_KM_H]) * NM_per_KM;
                dyn.vsi =               std::stod(tok[GNF_VERT_M_S]);
                dyn.pChannel =          this;
                
                // position
                positionTy pos (std::stod(tok[GNF_LAT]),
                                std::stod(tok[GNF_LON]),
                                std::stod(tok[GNF_ALT_M]),
// no weather correction, OGN delivers geo altitude?   dataRefs.WeatherAltCorr_m(std::stod(tok[GNF_ALT_M])),
                                dyn.ts,
                                dyn.heading);
                pos.f.onGrnd = GND_UNKNOWN;         // there is no GND indicator in OGN data
                
                // Update the slug with current position
                snprintf(buf, sizeof(buf), OPGLIDER_CHECK_URL,
                         pos.lat(), pos.lon());
                stat.slug = buf;
                // Update static data
                fd.UpdateData(std::move(stat), pos.dist(viewPos));
                
                // position is rather important, we check for validity
                // (we do allow alt=NAN if on ground)
                if ( pos.isNormal(true) )
                    fd.AddDynData(dyn, 0, 0, &pos);
                else
                    LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
            }
        } catch(const std::system_error& e) {
            LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
        }
    }
    
    // success
    return true;
}